

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O3

void lws_sul_schedule(lws_context *ctx,int tsi,lws_sorted_usec_list_t *sul,sul_cb_t _cb,
                     lws_usec_t _us)

{
  lws_usec_t lVar1;
  
  if (_cb == (sul_cb_t)0x0) {
    __assert_fail("_cb",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/sorted-usec-list.c"
                  ,0x115,
                  "void lws_sul_schedule(struct lws_context *, int, lws_sorted_usec_list_t *, sul_cb_t, lws_usec_t)"
                 );
  }
  if (_us != -1) {
    sul->cb = _cb;
    lVar1 = lws_now_usecs();
    sul->us = lVar1 + _us;
    lws_sul2_schedule(ctx,tsi,0,sul);
    return;
  }
  lws_dll2_remove(&sul->list);
  sul->us = 0;
  return;
}

Assistant:

void
lws_sul_schedule(struct lws_context *ctx, int tsi, lws_sorted_usec_list_t *sul,
		 sul_cb_t _cb, lws_usec_t _us)
{
	struct lws_context_per_thread *_pt = &ctx->pt[tsi];

	assert(_cb);

	lws_pt_lock(_pt, __func__);

	if (_us == (lws_usec_t)LWS_SET_TIMER_USEC_CANCEL)
		lws_sul_cancel(sul);
	else {
		sul->cb = _cb;
		sul->us = lws_now_usecs() + _us;
		lws_sul2_schedule(ctx, tsi, LWSSULLI_MISS_IF_SUSPENDED, sul);
	}

	lws_pt_unlock(_pt);
}